

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O3

NextCommentStatus __thiscall
google::protobuf::io::Tokenizer::TryConsumeCommentStart(Tokenizer *this)

{
  int iVar1;
  
  if (this->comment_style_ == CPP_COMMENT_STYLE) {
    if (this->current_char_ != '/') {
      return NO_COMMENT;
    }
    NextChar(this);
    if (this->current_char_ == '*') {
      NextChar(this);
      return BLOCK_COMMENT;
    }
    if (this->current_char_ != '/') {
      (this->current_).type = TYPE_SYMBOL;
      std::__cxx11::string::_M_replace
                ((ulong)&(this->current_).text,0,(char *)(this->current_).text._M_string_length,
                 0x1ceeae);
      iVar1 = this->column_;
      (this->current_).line = this->line_;
      (this->current_).column = iVar1 + -1;
      (this->current_).end_column = iVar1;
      return SLASH_NOT_COMMENT;
    }
  }
  else if (this->current_char_ != '#' || this->comment_style_ != SH_COMMENT_STYLE) {
    return NO_COMMENT;
  }
  NextChar(this);
  return LINE_COMMENT;
}

Assistant:

Tokenizer::NextCommentStatus Tokenizer::TryConsumeCommentStart() {
  if (comment_style_ == CPP_COMMENT_STYLE && TryConsume('/')) {
    if (TryConsume('/')) {
      return LINE_COMMENT;
    } else if (TryConsume('*')) {
      return BLOCK_COMMENT;
    } else {
      // Oops, it was just a slash.  Return it.
      current_.type = TYPE_SYMBOL;
      current_.text = "/";
      current_.line = line_;
      current_.column = column_ - 1;
      current_.end_column = column_;
      return SLASH_NOT_COMMENT;
    }
  } else if (comment_style_ == SH_COMMENT_STYLE && TryConsume('#')) {
    return LINE_COMMENT;
  } else {
    return NO_COMMENT;
  }
}